

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

RROutput __thiscall
sf::priv::WindowImplX11::getOutputPrimary
          (WindowImplX11 *this,Window *rootWindow,XRRScreenResources *res,int xRandRMajor,
          int xRandRMinor)

{
  RROutput output;
  int xRandRMinor_local;
  int xRandRMajor_local;
  XRRScreenResources *res_local;
  Window *rootWindow_local;
  WindowImplX11 *this_local;
  
  if (((xRandRMajor == 1) && (2 < xRandRMinor)) || (1 < xRandRMajor)) {
    this_local = (WindowImplX11 *)XRRGetOutputPrimary(this->m_display,*rootWindow);
    if (this_local == (WindowImplX11 *)0x0) {
      this_local = (WindowImplX11 *)*res->outputs;
    }
  }
  else {
    this_local = (WindowImplX11 *)*res->outputs;
  }
  return (RROutput)this_local;
}

Assistant:

RROutput WindowImplX11::getOutputPrimary(::Window& rootWindow, XRRScreenResources* res, int xRandRMajor, int xRandRMinor)
{
    // if xRandR version >= 1.3 get the primary screen else take the first screen
    if ((xRandRMajor == 1 && xRandRMinor >= 3) || xRandRMajor > 1)
    {
        RROutput output = XRRGetOutputPrimary(m_display, rootWindow);

        // Check if returned output is valid, otherwise use the first screen
        if (output == None)
            return res->outputs[0];
        else
            return output;
    }

    // xRandr version can't get the primary screen, use the first screen
    return res->outputs[0];
}